

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,SerialIter *sit,SField *name)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint64_t uVar4;
  exponent_type eVar5;
  mantissa_type mVar6;
  Issue local_68;
  base_uint<160UL,_void> local_34;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
  (this->mIssue).currency.pn[0] = 0;
  (this->mIssue).currency.pn[1] = 0;
  (this->mIssue).currency.pn[2] = 0;
  (this->mIssue).currency.pn[3] = 0;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = 0;
  (this->mIssue).account.pn[1] = 0;
  (this->mIssue).account.pn[2] = 0;
  (this->mIssue).account.pn[3] = 0;
  (this->mIssue).account.pn[4] = 0;
  uVar4 = SerialIter::get64(sit);
  if ((long)uVar4 < 0) {
    local_68.currency.pn[4] = 0;
    local_68.account.pn[0] = 0;
    local_68.account.pn[1] = 0;
    local_68.account.pn[2] = 0;
    local_68.currency.pn[0] = 0;
    local_68.currency.pn[1] = 0;
    local_68.currency.pn[2] = 0;
    local_68.currency.pn[3] = 0;
    local_68.account.pn[3] = 0;
    local_68.account.pn[4] = 0;
    SerialIter::getBitString<160,void>((base_uint<160UL,_void> *)&local_68,sit);
    bVar3 = beast::operator==(&local_68);
    if (bVar3) {
      Throw<std::runtime_error,char_const(&)[24]>((char (*) [24])"invalid native currency");
    }
    SerialIter::getBitString<160,void>(&local_34,sit);
    local_68.account.pn[0] = local_34.pn[0];
    bVar3 = beast::operator==();
    if (bVar3) {
      Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid native account");
    }
    mVar6 = uVar4 & 0x3fffffffffffff;
    uVar2 = (uint)(uVar4 >> 0x20);
    if (mVar6 == 0) {
      if (uVar2 >> 0x16 != 0x200) goto LAB_001d7338;
      mVar6 = 0;
      eVar5 = 0;
      bVar3 = false;
    }
    else {
      if ((mVar6 + 0xffdc790d903f0000 < 0xffe0068c35058000) ||
         (uVar1 = uVar2 >> 0x16 & 0xff, uVar1 - 0xb2 < 0xffffff4f)) {
LAB_001d7338:
        Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid currency value");
      }
      eVar5 = uVar1 - 0x61;
      bVar3 = (uVar2 >> 0x1e & 1) == 0;
    }
    Issue::operator=(&this->mIssue,&local_68);
    this->mValue = mVar6;
    this->mOffset = eVar5;
    this->mIsNegative = bVar3;
    canonicalize(this);
  }
  else if (uVar4 < 0x4000000000000000) {
    if (uVar4 == 0) {
      Throw<std::runtime_error,char_const(&)[31]>((char (*) [31])"negative zero is not canonical");
    }
    this->mValue = uVar4;
    this->mOffset = 0;
    this->mIsNative = true;
    this->mIsNegative = true;
  }
  else {
    this->mValue = uVar4 & 0x3fffffffffffffff;
    this->mOffset = 0;
    this->mIsNative = true;
    this->mIsNegative = false;
  }
  return;
}

Assistant:

STAmount::STAmount(SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::uint64_t value = sit.get64 ();

    // native
    if ((value & cNotNative) == 0)
    {
        // positive
        if ((value & cPosNative) != 0)
        {
            mValue = value & ~cPosNative;
            mOffset = 0;
            mIsNative = true;
            mIsNegative = false;
            return;
        }

        // negative
        if (value == 0)
            Throw<std::runtime_error> ("negative zero is not canonical");

        mValue = value;
        mOffset = 0;
        mIsNative = true;
        mIsNegative = true;
        return;
    }

    Issue issue;
    issue.currency.copyFrom (sit.get160 ());

    if (isXRP (issue.currency))
        Throw<std::runtime_error> ("invalid native currency");

    issue.account.copyFrom (sit.get160 ());

    if (isXRP (issue.account))
        Throw<std::runtime_error> ("invalid native account");

    // 10 bits for the offset, sign and "not native" flag
    int offset = static_cast<int>(value >> (64 - 10));

    value &= ~ (1023ull << (64 - 10));

    if (value)
    {
        bool isNegative = (offset & 256) == 0;
        offset = (offset & 255) - 97; // center the range

        if (value < cMinValue ||
            value > cMaxValue ||
            offset < cMinOffset ||
            offset > cMaxOffset)
        {
            Throw<std::runtime_error> ("invalid currency value");
        }

        mIssue = issue;
        mValue = value;
        mOffset = offset;
        mIsNegative = isNegative;
        canonicalize();
        return;
    }

    if (offset != 512)
        Throw<std::runtime_error> ("invalid currency value");

    mIssue = issue;
    mValue = 0;
    mOffset = 0;
    mIsNegative = false;
    canonicalize();
}